

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UBool __thiscall
icu_63::UnicodeString::padTrailing(UnicodeString *this,int32_t targetLength,UChar padChar)

{
  short sVar1;
  ushort uVar2;
  UBool UVar3;
  char16_t *pcVar4;
  long lVar5;
  int32_t iVar6;
  UBool UVar7;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  UVar7 = '\0';
  if (iVar6 < targetLength) {
    UVar3 = cloneArrayIfNeeded(this,targetLength,-1,'\x01',(int32_t **)0x0,'\0');
    UVar7 = '\0';
    if (UVar3 != '\0') {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&this->fUnion + 2);
      }
      if (iVar6 < targetLength) {
        lVar5 = (long)targetLength;
        do {
          pcVar4[lVar5 + -1] = padChar;
          lVar5 = lVar5 + -1;
        } while (iVar6 < lVar5);
      }
      uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (targetLength < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(targetLength << 5) | uVar2 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
        (this->fUnion).fFields.fLength = targetLength;
      }
      UVar7 = '\x01';
    }
  }
  return UVar7;
}

Assistant:

UBool 
UnicodeString::padTrailing(int32_t targetLength,
                           UChar padChar)
{
  int32_t oldLength = length();
  if(oldLength >= targetLength || !cloneArrayIfNeeded(targetLength)) {
    return FALSE;
  } else {
    // fill in padding character
    UChar *array = getArrayStart();
    int32_t length = targetLength;
    while(--length >= oldLength) {
      array[length] = padChar;
    }
    setLength(targetLength);
    return TRUE;
  }
}